

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O3

void append_float(t_append *x,t_float f)

{
  t_gpointer *gp;
  t_symbol *s;
  t_gstub *ptVar1;
  _glist *owner;
  t_template *x_00;
  _glist *x_01;
  _glist *extraout_RAX;
  _glist *p_Var2;
  _gobj **pp_Var3;
  char *pcVar4;
  char *fmt;
  t_appendvariable *ptVar5;
  int iVar6;
  
  s = x->x_templatesym;
  if (s->s_name == (char *)0x0) {
    pcVar4 = "append: no template supplied";
  }
  else {
    iVar6 = x->x_nin;
    ptVar1 = (x->x_gp).gp_stub;
    x_00 = template_findbyname(s);
    if (x_00 == (t_template *)0x0) {
      pcVar4 = s->s_name;
      fmt = "append: couldn\'t find template %s";
LAB_00164ce2:
      pd_error(x,fmt,pcVar4);
      return;
    }
    if (ptVar1 == (t_gstub *)0x0) {
      pcVar4 = "append: no current pointer";
    }
    else if (ptVar1->gs_which == 1) {
      owner = (ptVar1->gs_un).gs_glist;
      if (owner->gl_valid == (x->x_gp).gp_valid) {
        if (iVar6 == 0) {
          return;
        }
        x->x_variables->gv_f = f;
        x_01 = (_glist *)scalar_new(owner,s);
        if (x_01 != (_glist *)0x0) {
          gp = &x->x_gp;
          pp_Var3 = &(((gp->gp_un).gp_scalar)->sc_gobj).g_next;
          if ((gp->gp_un).gp_scalar == (_scalar *)0x0) {
            pp_Var3 = &owner->gl_list;
          }
          (x_01->gl_obj).te_g.g_next = *pp_Var3;
          *pp_Var3 = (_gobj *)x_01;
          (gp->gp_un).gp_scalar = (_scalar *)x_01;
          p_Var2 = x_01;
          if (0 < iVar6) {
            ptVar5 = x->x_variables;
            do {
              template_setfloat(x_00,ptVar5->gv_sym,(t_word *)&(x_01->gl_obj).te_outlet,ptVar5->gv_f
                                ,1);
              ptVar5 = ptVar5 + 1;
              iVar6 = iVar6 + -1;
              p_Var2 = extraout_RAX;
            } while (iVar6 != 0);
          }
          p_Var2 = glist_getcanvas(p_Var2);
          iVar6 = glist_isvisible(p_Var2);
          if (iVar6 != 0) {
            gobj_vis((t_gobj *)x_01,owner,1);
          }
          outlet_pointer((x->x_obj).te_outlet,gp);
          return;
        }
        pcVar4 = s->s_name;
        fmt = "%s: couldn\'t create scalar";
        goto LAB_00164ce2;
      }
      pcVar4 = "append: stale pointer";
    }
    else {
      pcVar4 = "append: lists only, not arrays";
    }
  }
  pd_error(x,pcVar4);
  return;
}

Assistant:

static void append_float(t_append *x, t_float f)
{
    int nitems = x->x_nin, i;
    t_symbol *templatesym = x->x_templatesym;
    t_template *template;
    t_appendvariable *vp;
    t_gpointer *gp = &x->x_gp;
    t_gstub *gs = gp->gp_stub;
    t_word *vec;
    t_scalar *sc, *oldsc;
    t_glist *glist;

    if (!templatesym->s_name)
    {
        pd_error(x, "append: no template supplied");
        return;
    }
    template = template_findbyname(templatesym);
    if (!template)
    {
        pd_error(x, "append: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (!gs)
    {
        pd_error(x, "append: no current pointer");
        return;
    }
    if (gs->gs_which != GP_GLIST)
    {
        pd_error(x, "append: lists only, not arrays");
        return;
    }
    glist = gs->gs_un.gs_glist;
    if (glist->gl_valid != gp->gp_valid)
    {
        pd_error(x, "append: stale pointer");
        return;
    }
    if (!nitems) return;
    x->x_variables[0].gv_f = f;

    sc = scalar_new(glist, templatesym);
    if (!sc)
    {
        pd_error(x, "%s: couldn't create scalar", templatesym->s_name);
        return;
    }
    oldsc = gp->gp_un.gp_scalar;

    if (oldsc)
    {
        sc->sc_gobj.g_next = oldsc->sc_gobj.g_next;
        oldsc->sc_gobj.g_next = &sc->sc_gobj;
    }
    else
    {
        sc->sc_gobj.g_next = glist->gl_list;
        glist->gl_list = &sc->sc_gobj;
    }

    gp->gp_un.gp_scalar = sc;
    vec = sc->sc_vec;
    for (i = 0, vp = x->x_variables; i < nitems; i++, vp++)
    {
        template_setfloat(template, vp->gv_sym, vec, vp->gv_f, 1);
    }

    if (glist_isvisible(glist_getcanvas(glist)))
        gobj_vis(&sc->sc_gobj, glist, 1);
    /*  scalar_redraw(sc, glist);  ... have to do 'vis' instead here because
    redraw assumes we're already visible??? ... */

    outlet_pointer(x->x_obj.ob_outlet, gp);
}